

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined4 *puVar4;
  bool bVar5;
  _Bool *done_00;
  _Bool _Var6;
  char cVar7;
  CURLcode CVar8;
  int iVar9;
  imapstate iVar10;
  curl_off_t cVar11;
  size_t sVar12;
  long lVar13;
  Curl_easy *data;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *value;
  char *name;
  char *local_58;
  char *local_50;
  size_t local_48;
  connectdata *local_40;
  _Bool *local_38;
  
  *done = false;
  pCVar2 = conn->data;
  pvVar3 = (pCVar2->req).protop;
  pcVar15 = (pCVar2->state).up.path;
  lVar13 = 1;
  pcVar14 = pcVar15;
  local_38 = done;
  do {
    pcVar16 = pcVar14;
    pcVar14 = pcVar16 + 1;
    _Var6 = imap_is_bchar(pcVar16[1]);
    lVar13 = lVar13 + -1;
  } while (_Var6);
  if (lVar13 == 0) {
    *(undefined8 *)((long)pvVar3 + 8) = 0;
  }
  else {
    pcVar15 = pcVar15 + 1;
    if (*pcVar16 != '/') {
      pcVar16 = pcVar14;
    }
    CVar8 = Curl_urldecode(pCVar2,pcVar15,(long)pcVar16 - (long)pcVar15,(char **)((long)pvVar3 + 8),
                           (size_t *)0x0,REJECT_CTRL);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  cVar7 = *pcVar14;
  while (cVar7 == ';') {
    pcVar15 = pcVar14 + 1;
    pcVar16 = pcVar14 + 2;
    sVar12 = 0;
    pcVar14 = pcVar15;
    while( true ) {
      if (pcVar16[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar16[-1] == '=') break;
      pcVar16 = pcVar16 + 1;
      sVar12 = sVar12 + 1;
      pcVar14 = pcVar14 + 1;
    }
    local_40 = conn;
    CVar8 = Curl_urldecode(pCVar2,pcVar15,sVar12,&local_50,(size_t *)0x0,REJECT_CTRL);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    sVar12 = 0xffffffffffffffff;
    do {
      pcVar15 = pcVar14 + 1;
      pcVar14 = pcVar14 + 1;
      _Var6 = imap_is_bchar(*pcVar15);
      sVar12 = sVar12 + 1;
    } while (_Var6);
    CVar8 = Curl_urldecode(pCVar2,pcVar16,sVar12,&local_58,&local_48,REJECT_CTRL);
    if (CVar8 != CURLE_OK) {
      (*Curl_cfree)(local_50);
      return CVar8;
    }
    iVar9 = Curl_strcasecompare(local_50,"UIDVALIDITY");
    if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x10) != 0)) {
      iVar9 = Curl_strcasecompare(local_50,"UID");
      if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x18) != 0)) {
        iVar9 = Curl_strcasecompare(local_50,"MAILINDEX");
        conn = local_40;
        if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x20) != 0)) {
          iVar9 = Curl_strcasecompare(local_50,"SECTION");
          if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x28) != 0)) {
            iVar9 = Curl_strcasecompare(local_50,"PARTIAL");
            if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x30) != 0)) {
              (*Curl_cfree)(local_50);
              (*Curl_cfree)(local_58);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
              local_58[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar3 + 0x30) = local_58;
          }
          else {
            if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
              local_58[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar3 + 0x28) = local_58;
          }
        }
        else {
          if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
            local_58[local_48 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x20) = local_58;
        }
      }
      else {
        if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
          local_58[local_48 - 1] = '\0';
        }
        *(char **)((long)pvVar3 + 0x18) = local_58;
        conn = local_40;
      }
    }
    else {
      if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
        local_58[local_48 - 1] = '\0';
      }
      *(char **)((long)pvVar3 + 0x10) = local_58;
      conn = local_40;
    }
    local_58 = (char *)0x0;
    (*Curl_cfree)(local_50);
    (*Curl_cfree)(local_58);
    cVar7 = *pcVar14;
  }
  if (((*(long *)((long)pvVar3 + 8) != 0) && (*(long *)((long)pvVar3 + 0x18) == 0)) &&
     (*(long *)((long)pvVar3 + 0x20) == 0)) {
    curl_url_get((pCVar2->state).uh,CURLUPART_QUERY,(char **)((long)pvVar3 + 0x38),0x40);
    cVar7 = *pcVar14;
  }
  done_00 = local_38;
  if (cVar7 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pCVar2 = conn->data;
  pcVar15 = (pCVar2->set).str[6];
  if (pcVar15 != (char *)0x0) {
    pvVar3 = (pCVar2->req).protop;
    CVar8 = Curl_urldecode(pCVar2,pcVar15,0,(char **)((long)pvVar3 + 0x40),(size_t *)0x0,REJECT_CTRL
                          );
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    pcVar15 = *(char **)((long)pvVar3 + 0x40);
    pcVar14 = pcVar15;
    for (; *pcVar15 != '\0'; pcVar15 = pcVar15 + 1) {
      if (*pcVar15 == ' ') {
        pcVar15 = (*Curl_cstrdup)(pcVar15);
        *(char **)((long)pvVar3 + 0x48) = pcVar15;
        *pcVar14 = '\0';
        if (*(long *)((long)pvVar3 + 0x48) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar14 = pcVar14 + 1;
    }
  }
  pCVar2 = conn->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn->data;
  puVar4 = (undefined4 *)(pCVar2->req).protop;
  if (((pCVar2->set).field_0x97b & 0x10) != 0) {
    *puVar4 = 1;
  }
  *done_00 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar15 = (conn->proto).imapc.mailbox, pcVar15 == (char *)0x0)) ||
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar15), iVar9 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar15 = (conn->proto).imapc.mailbox_uidvalidity, pcVar15 != (char *)0x0)) &&
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar15), iVar9 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  data = conn->data;
  if ((((data->set).field_0x97b & 0x20) != 0) || ((pCVar2->set).mimepost.kind != MIMEKIND_NONE)) {
    pvVar3 = (data->req).protop;
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pcVar15 = "Cannot APPEND without a mailbox.";
      goto LAB_00128f48;
    }
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      cVar11 = (data->state).infilesize;
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar8 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      pcVar15 = Curl_checkheaders(conn,"Mime-Version");
      if ((pcVar15 == (char *)0x0) &&
         (CVar8 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar8 != CURLE_OK)) {
        return CVar8;
      }
      CVar8 = Curl_mime_rewind(part);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      cVar11 = Curl_mime_size(part);
      (data->state).infilesize = cVar11;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if (cVar11 < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar15 = imap_atom(*(char **)((long)pvVar3 + 8),false);
    if (pcVar15 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar8 = imap_sendf(conn,"APPEND %s (\\Seen) {%ld}",pcVar15);
    (*Curl_cfree)(pcVar15);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    iVar10 = IMAP_APPEND;
LAB_001290f2:
    (conn->proto).imapc.state = iVar10;
    goto LAB_00129136;
  }
  if (*(long *)(puVar4 + 0x10) == 0) {
    if (!bVar5) {
      if (*(long *)(puVar4 + 2) != 0) {
        if ((*(long *)(puVar4 + 6) == 0) && (*(long *)(puVar4 + 8) == 0)) {
          lVar13 = *(long *)(puVar4 + 0xe);
          goto joined_r0x00129078;
        }
        goto LAB_0012907e;
      }
      goto LAB_00129124;
    }
    if ((*(long *)(puVar4 + 6) == 0) && (*(long *)(puVar4 + 8) == 0)) {
      if (*(long *)(puVar4 + 0xe) == 0) goto LAB_00129124;
      CVar8 = imap_perform_search(conn);
    }
    else {
      CVar8 = imap_perform_fetch(conn);
    }
  }
  else {
    if (!bVar5) {
      lVar13 = *(long *)(puVar4 + 2);
joined_r0x00129078:
      if (lVar13 != 0) {
LAB_0012907e:
        pvVar3 = (data->req).protop;
        (*Curl_cfree)((conn->proto).imapc.mailbox);
        (conn->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
        (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar15 = *(char **)((long)pvVar3 + 8);
        if (pcVar15 == (char *)0x0) {
          data = conn->data;
          pcVar15 = "Cannot SELECT without a mailbox.";
LAB_00128f48:
          Curl_failf(data,pcVar15);
          return CURLE_URL_MALFORMAT;
        }
        pcVar15 = imap_atom(pcVar15,false);
        if (pcVar15 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar8 = imap_sendf(conn,"SELECT %s",pcVar15);
        (*Curl_cfree)(pcVar15);
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        iVar10 = IMAP_SELECT;
        goto LAB_001290f2;
      }
    }
LAB_00129124:
    CVar8 = imap_perform_list(conn);
  }
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_00129136:
  CVar8 = imap_multi_statemach(conn,done_00);
  if (CVar8 == CURLE_OK) {
    CVar8 = CURLE_OK;
    if ((*done_00 == true) && (CVar8 = CURLE_OK, *(conn->data->req).protop != 0)) {
      CVar8 = CURLE_OK;
      Curl_setup_transfer(conn->data,-1,-1,false,-1);
    }
  }
  return CVar8;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}